

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnImportTable
          (BinaryReaderIR *this,Index import_index,string_view module_name,string_view field_name,
          Index table_index,Type elem_type,Limits *elem_limits)

{
  Module *this_00;
  char *__s;
  Offset OVar1;
  uint64_t uVar2;
  undefined8 *puVar3;
  size_t sVar4;
  __uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> local_38;
  
  puVar3 = (undefined8 *)operator_new(0x90);
  puVar3[1] = puVar3 + 3;
  puVar3[2] = 0;
  *(undefined1 *)(puVar3 + 3) = 0;
  puVar3[5] = puVar3 + 7;
  puVar3[6] = 0;
  *(undefined1 *)(puVar3 + 7) = 0;
  *(undefined4 *)(puVar3 + 9) = 1;
  *puVar3 = &PTR__TableImport_00248e68;
  puVar3[10] = puVar3 + 0xc;
  puVar3[0xb] = 0;
  *(undefined1 *)(puVar3 + 0xc) = 0;
  puVar3[0xe] = 0;
  puVar3[0xf] = 0;
  *(undefined4 *)((long)puVar3 + 0x7f) = 0;
  puVar3[0x11] = 0xfffffffffffffff0;
  std::__cxx11::string::_M_replace((ulong)(puVar3 + 1),0,(char *)0x0,(ulong)module_name._M_str);
  std::__cxx11::string::_M_replace((ulong)(puVar3 + 5),0,(char *)puVar3[6],(ulong)field_name._M_str)
  ;
  uVar2 = elem_limits->max;
  puVar3[0xe] = elem_limits->initial;
  puVar3[0xf] = uVar2;
  *(undefined4 *)((long)puVar3 + 0x7f) = *(undefined4 *)((long)&elem_limits->max + 7);
  *(Type *)(puVar3 + 0x11) = elem_type;
  this_00 = this->module_;
  __s = this->filename_;
  sVar4 = strlen(__s);
  OVar1 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_38._M_t.
  super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>.
  super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl =
       (tuple<wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>)
       operator_new(0x48);
  *(long *)((long)local_38._M_t.
                  super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                  .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 8) = 0;
  *(long *)((long)local_38._M_t.
                  super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                  .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x10) = 0;
  *(size_t *)
   ((long)local_38._M_t.
          super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
          .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x18) = sVar4;
  *(char **)((long)local_38._M_t.
                   super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                   .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x20) =
       __s;
  *(Offset *)
   ((long)local_38._M_t.
          super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
          .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x28) = OVar1;
  *(long *)((long)local_38._M_t.
                  super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                  .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x30) = 0;
  *(undefined4 *)
   ((long)local_38._M_t.
          super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
          .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x38) = 2;
  *(undefined ***)
   local_38._M_t.
   super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>.
   super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl =
       &PTR__ImportModuleField_00248bc8;
  *(undefined8 **)
   ((long)local_38._M_t.
          super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
          .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x40) = puVar3;
  Module::AppendField(this_00,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                               *)&local_38);
  if ((_Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>)
      local_38._M_t.
      super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
      .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl !=
      (ImportModuleField *)0x0) {
    (**(code **)(*(long *)local_38._M_t.
                          super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                          .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 8)
    )();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnImportTable(Index import_index,
                                     std::string_view module_name,
                                     std::string_view field_name,
                                     Index table_index,
                                     Type elem_type,
                                     const Limits* elem_limits) {
  auto import = std::make_unique<TableImport>();
  import->module_name = module_name;
  import->field_name = field_name;
  import->table.elem_limits = *elem_limits;
  import->table.elem_type = elem_type;
  module_->AppendField(
      std::make_unique<ImportModuleField>(std::move(import), GetLocation()));
  return Result::Ok;
}